

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::GetRemainingArguments
          (CommandLineArguments *this,int *argc,char ***argv)

{
  long lVar1;
  Internal *pIVar2;
  size_type sVar3;
  long lVar4;
  char **ppcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  pIVar2 = this->Internals;
  lVar4 = ((long)(pIVar2->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                 super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pIVar2->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                 super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) - pIVar2->LastArgument;
  ppcVar5 = (char **)operator_new__(-(ulong)(lVar4 + 1U >> 0x3d != 0) | lVar4 * 8 + 8U);
  pcVar6 = (char *)operator_new__((pIVar2->Argv0).super_string._M_string_length + 1);
  *ppcVar5 = pcVar6;
  strcpy(pcVar6,(pIVar2->Argv0).super_string._M_dataplus._M_p);
  sVar3 = pIVar2->LastArgument;
  lVar4 = (long)(pIVar2->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = 1;
  if (sVar3 + 1 <
      (ulong)((long)(pIVar2->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                    super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                    super__Vector_impl_data._M_finish - lVar4 >> 5)) {
    lVar8 = sVar3 << 5;
    lVar7 = 1;
    do {
      pcVar6 = (char *)operator_new__(*(long *)(lVar4 + 0x28 + lVar8) + 1);
      ppcVar5[lVar7] = pcVar6;
      strcpy(pcVar6,*(char **)((long)(pIVar2->Argv).
                                     super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                                     super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x20 + lVar8));
      lVar4 = (long)(pIVar2->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                    super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                    super__Vector_impl_data._M_start;
      lVar1 = sVar3 + lVar7;
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (lVar1 + 1U <
             (ulong)((long)(pIVar2->Argv).
                           super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                           .super__Vector_impl_data._M_finish - lVar4 >> 5));
  }
  *argc = (int)lVar7;
  *argv = ppcVar5;
  return;
}

Assistant:

void CommandLineArguments::GetRemainingArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size 
    = this->Internals->Argv.size() - this->Internals->LastArgument + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[ size ];
  args[0] = new char[ this->Internals->Argv0.size() + 1 ];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for ( cc = this->Internals->LastArgument+1; 
    cc < this->Internals->Argv.size(); cc ++ )
    {
    args[cnt] = new char[ this->Internals->Argv[cc].size() + 1];
    strcpy(args[cnt], this->Internals->Argv[cc].c_str());
    cnt ++;
    }
  *argc = cnt;
  *argv = args;
}